

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::request_subgroup_feature(CompilerGLSL *this,Feature feature)

{
  allocator local_39;
  string local_38;
  
  if ((this->options).vulkan_semantics == true) {
    ::std::__cxx11::string::string
              ((string *)&local_38,
               ShaderSubgroupSupportHelper::get_extension_name::retval
               [ShaderSubgroupSupportHelper::get_KHR_extension_for_feature::extensions[feature]],
               &local_39);
    require_extension_internal(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  if (((this->shader_subgroup_supporter).feature_mask >>
       (feature & (FeatureCount|SubgroupBallotBitCount)) & 1) == 0) {
    Compiler::force_recompile(&this->super_Compiler);
  }
  ShaderSubgroupSupportHelper::request_feature(&this->shader_subgroup_supporter,feature);
  return;
}

Assistant:

void CompilerGLSL::request_subgroup_feature(ShaderSubgroupSupportHelper::Feature feature)
{
	if (options.vulkan_semantics)
	{
		auto khr_extension = ShaderSubgroupSupportHelper::get_KHR_extension_for_feature(feature);
		require_extension_internal(ShaderSubgroupSupportHelper::get_extension_name(khr_extension));
	}
	else
	{
		if (!shader_subgroup_supporter.is_feature_requested(feature))
			force_recompile();
		shader_subgroup_supporter.request_feature(feature);
	}
}